

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkInteger
          (GetConfigAttribSimpleCase *this,EGLenum attrib,EGLint value)

{
  ostringstream *this_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (value < 1 && attrib == 0x3028) {
    local_190._0_8_ =
         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Fail, config IDs should be positive integer values beginning from 1.",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkInteger (EGLenum attrib, EGLint value)
	{
		if (attrib == EGL_NATIVE_VISUAL_ID || attrib == EGL_NATIVE_VISUAL_TYPE) // Implementation-defined
			return;

		if (attrib == EGL_CONFIG_ID && value < 1)
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, config IDs should be positive integer values beginning from 1." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}